

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavSaveLastChildNavWindowIntoParent(ImGuiWindow *nav_window)

{
  bool bVar1;
  ImGuiWindow *parent;
  ImGuiWindow *nav_window_local;
  
  parent = nav_window;
  while( true ) {
    bVar1 = false;
    if ((parent != (ImGuiWindow *)0x0) && (bVar1 = false, parent->RootWindow != parent)) {
      bVar1 = (parent->Flags & 0x14000000U) == 0;
    }
    if (!bVar1) break;
    parent = parent->ParentWindow;
  }
  if ((parent != (ImGuiWindow *)0x0) && (parent != nav_window)) {
    parent->NavLastChildNavWindow = nav_window;
  }
  return;
}

Assistant:

static void ImGui::NavSaveLastChildNavWindowIntoParent(ImGuiWindow* nav_window)
{
    ImGuiWindow* parent = nav_window;
    while (parent && parent->RootWindow != parent && (parent->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu)) == 0)
        parent = parent->ParentWindow;
    if (parent && parent != nav_window)
        parent->NavLastChildNavWindow = nav_window;
}